

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

float FastLog2Slow_C(uint32_t v)

{
  int iVar1;
  byte bVar2;
  uint in_EDI;
  double dVar3;
  int correction;
  double log_2;
  uint32_t orig_v;
  uint32_t y;
  int log_cnt;
  float local_4;
  
  if (in_EDI < 0x10000) {
    iVar1 = BitsLog2Floor(in_EDI);
    bVar2 = (byte)(iVar1 + -7);
    local_4 = kLog2Table[in_EDI >> (bVar2 & 0x1f)] + (float)(iVar1 + -7);
    if (0xfff < in_EDI) {
      local_4 = (float)((in_EDI & (1 << (bVar2 & 0x1f)) - 1U) * 0x17 >> 4) / (float)in_EDI + local_4
      ;
    }
  }
  else {
    dVar3 = log((double)in_EDI);
    local_4 = (float)(dVar3 * 1.4426950408889634);
  }
  return local_4;
}

Assistant:

static float FastLog2Slow_C(uint32_t v) {
  assert(v >= LOG_LOOKUP_IDX_MAX);
  if (v < APPROX_LOG_WITH_CORRECTION_MAX) {
#if !defined(WEBP_HAVE_SLOW_CLZ_CTZ)
    // use clz if available
    const int log_cnt = BitsLog2Floor(v) - 7;
    const uint32_t y = 1 << log_cnt;
    const uint32_t orig_v = v;
    double log_2;
    v >>= log_cnt;
#else
    int log_cnt = 0;
    uint32_t y = 1;
    const uint32_t orig_v = v;
    double log_2;
    do {
      ++log_cnt;
      v = v >> 1;
      y = y << 1;
    } while (v >= LOG_LOOKUP_IDX_MAX);
#endif
    log_2 = kLog2Table[v] + log_cnt;
    if (orig_v >= APPROX_LOG_MAX) {
      // Since the division is still expensive, add this correction factor only
      // for large values of 'v'.
      const int correction = (23 * (orig_v & (y - 1))) >> 4;
      log_2 += (double)correction / orig_v;
    }
    return (float)log_2;
  } else {
    return (float)(LOG_2_RECIPROCAL * log((double)v));
  }
}